

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

nh_bool nh_view_replay_start(int fd,nh_window_procs *rwinprocs,nh_replay_info *info)

{
  nh_log_status nVar1;
  int iVar2;
  bool bVar3;
  undefined1 local_208 [8];
  nh_game_info gi;
  char namebuf [32];
  int playmode;
  nh_replay_info *info_local;
  nh_window_procs *rwinprocs_local;
  int fd_local;
  
  iVar2 = exit_jmp_buf_valid + 1;
  bVar3 = exit_jmp_buf_valid == 0;
  exit_jmp_buf_valid = iVar2;
  if ((bVar3) && (iVar2 = __sigsetjmp(exit_jmp_buf), iVar2 != 0)) {
    rwinprocs_local._7_1_ = '\0';
  }
  else {
    memset(info,0,0x50);
    if ((logfile == -1) &&
       (nVar1 = nh_get_savegame_status(fd,(nh_game_info *)local_208), nVar1 != LS_INVALID)) {
      program_state.restoring = 1;
      iflags.disable_log = '\x01';
      logfile = fd;
      replay_begin();
      replay_read_newgame(&turntime,(int *)(namebuf + 0x1c),gi.death + 0xfb,&u.initrole,&u.initrace,
                          &u.initgend,&u.initalign);
      replay_setup_windowprocs(rwinprocs);
      replay_run_cmdloop('\x01','\x01','\0');
      nh_start_game(fd,gi.death + 0xfb,u.initrole,u.initrace,u.initgend,u.initalign,namebuf._28_4_);
      program_state.restoring = 0;
      program_state.viewing = 1;
      replay_restore_windowprocs();
      flush_screen();
      info->max_moves = gi.level_desc._72_4_;
      info->max_actions = loginfo.actioncount - 1;
      find_next_command(info->nextcmd,0x40);
      update_inventory();
      make_checkpoint(0);
      exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
      rwinprocs_local._7_1_ = '\x01';
    }
    else {
      exit_jmp_buf_valid = exit_jmp_buf_valid + -1;
      rwinprocs_local._7_1_ = '\0';
    }
  }
  return rwinprocs_local._7_1_;
}

Assistant:

boolean nh_view_replay_start(int fd, struct nh_window_procs *rwinprocs,
			     struct nh_replay_info *info)
{
    int playmode;
    char namebuf[PL_NSIZ];
    struct nh_game_info gi;
        
    if (!api_entry_checkpoint())
	return FALSE;
    
    memset(info, 0, sizeof(struct nh_replay_info));
    if (logfile != -1 || nh_get_savegame_status(fd, &gi) == LS_INVALID) {
	api_exit();
	return FALSE;
    }
    
    program_state.restoring = TRUE;
    iflags.disable_log = TRUE;
    logfile = fd;
    replay_begin();
    replay_read_newgame(&turntime, &playmode, namebuf,
			&u.initrole, &u.initrace, &u.initgend, &u.initalign);
    replay_setup_windowprocs(rwinprocs);

    replay_run_cmdloop(TRUE, TRUE, FALSE); /* (re)set options */
    nh_start_game(fd, namebuf, u.initrole, u.initrace, u.initgend, u.initalign, playmode);
    program_state.restoring = FALSE;
    program_state.viewing = TRUE;
    replay_restore_windowprocs();
    
    /* the win_update_screen proc in the replay_windowprocs does nothing, so
     * flush (again) after switching back to regular window procs */
    flush_screen();
    
    info->max_moves = gi.moves;
    info->max_actions = loginfo.actioncount - 1; /* - 1 for the new-game ~ */
    find_next_command(info->nextcmd, sizeof(info->nextcmd));
    update_inventory();
    make_checkpoint(0);
    
    api_exit();
    
    return TRUE;
}